

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

char * make_tmp_buffer(FFSBuffer buf,int64_t size)

{
  long lVar1;
  char *ptr;
  char *s;
  
  lVar1 = buf->tmp_buffer_size;
  if (lVar1 < 0) {
    if (-lVar1 < size) {
      return (char *)0x0;
    }
    return (char *)buf->tmp_buffer;
  }
  if (lVar1 == 0) {
    s = (char *)0x400;
    if (0x400 < size) {
      s = (char *)size;
    }
    ptr = (char *)ffs_malloc((size_t)s);
    buf->tmp_buffer = ptr;
  }
  else {
    ptr = (char *)buf->tmp_buffer;
    if (size <= lVar1) goto LAB_0010e050;
    ptr = (char *)ffs_realloc(ptr,size);
    buf->tmp_buffer = ptr;
    s = ptr;
    if (ptr != (char *)0x0) {
      s = (char *)size;
    }
  }
  buf->tmp_buffer_size = (ssize_t)s;
LAB_0010e050:
  buf->tmp_buffer_in_use_size = size;
  return ptr;
}

Assistant:

extern
char *
make_tmp_buffer(FFSBuffer buf, int64_t size)
{
    if (buf->tmp_buffer_size < 0) {
	/* fixed size buffer */
	if (size > (-buf->tmp_buffer_size)) return NULL;
	return buf->tmp_buffer;
    }
    if (buf->tmp_buffer_size == 0) {
	int64_t tmp_size = Max(size, TMP_BUFFER_INIT_SIZE);
	buf->tmp_buffer = malloc(tmp_size);
	buf->tmp_buffer_size = tmp_size;
    }
    if (size > buf->tmp_buffer_size) {
	buf->tmp_buffer = realloc(buf->tmp_buffer, size);
	if (buf->tmp_buffer) {
	    buf->tmp_buffer_size = size;
	} else {
	    buf->tmp_buffer_size = 0;
	}
    }
    buf->tmp_buffer_in_use_size = size;
    return buf->tmp_buffer;
}